

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseStorage.h
# Opt level: O1

void __thiscall
Eigen::DenseStorage<int,_-1,_-1,_1,_0>::DenseStorage
          (DenseStorage<int,__1,__1,_1,_0> *this,DenseIndex size,DenseIndex nbRows,
          DenseIndex param_3)

{
  int *piVar1;
  undefined8 *puVar2;
  
  if (size != 0) {
    if ((ulong)size >> 0x3e == 0) {
      piVar1 = (int *)malloc(size << 2);
      if (piVar1 != (int *)0x0) goto LAB_0010a5eb;
    }
    puVar2 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar2 = operator_delete;
    __cxa_throw(puVar2,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  piVar1 = (int *)0x0;
LAB_0010a5eb:
  this->m_data = piVar1;
  this->m_rows = nbRows;
  return;
}

Assistant:

DenseStorage(DenseIndex size, DenseIndex nbRows, DenseIndex) : m_data(internal::conditional_aligned_new_auto<T,(_Options&DontAlign)==0>(size)), m_rows(nbRows)
    { EIGEN_INTERNAL_DENSE_STORAGE_CTOR_PLUGIN }